

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcExact.c
# Opt level: O2

void Abc_ExactStoreTest(int fVerbose)

{
  int iVar1;
  Abc_Ntk_t *pNtk;
  char *pcVar2;
  Vec_Ptr_t *vNames;
  Abc_Obj_t *pAVar3;
  long lVar4;
  int Cost;
  char pPerm [4];
  int local_78 [4];
  word pTruth [4];
  Abc_Obj_t *pFanins [4];
  
  pTruth[2] = 0;
  pTruth[3] = 0;
  pTruth[0] = 0xcafe;
  pTruth[1] = 0;
  pPerm[0] = '\0';
  pPerm[1] = '\0';
  pPerm[2] = '\0';
  pPerm[3] = '\0';
  local_78[0] = 6;
  local_78[1] = 2;
  local_78[2] = 8;
  local_78[3] = 5;
  Cost = 0;
  pNtk = Abc_NtkAlloc(ABC_NTK_LOGIC,ABC_FUNC_SOP,1);
  pcVar2 = Extra_UtilStrsav("exact");
  pNtk->pName = pcVar2;
  vNames = Abc_NodeGetFakeNames(4);
  Vec_PtrPush(pNtk->vObjs,(void *)0x0);
  for (lVar4 = 0; lVar4 != 4; lVar4 = lVar4 + 1) {
    pAVar3 = Abc_NtkCreatePi(pNtk);
    pFanins[lVar4] = pAVar3;
    pcVar2 = (char *)Vec_PtrEntry(vNames,(int)lVar4);
    Abc_ObjAssignName(pAVar3,pcVar2,(char *)0x0);
  }
  Abc_NodeFreeNames(vNames);
  Abc_ExactStart(10000,1,fVerbose,0,(char *)0x0);
  pAVar3 = Abc_ExactBuildNode(pTruth,4,local_78,pFanins,pNtk);
  if (pAVar3 != (Abc_Obj_t *)0x0) {
    __assert_fail("!Abc_ExactBuildNode( pTruth, 4, pArrTimeProfile, pFanins, pNtk )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcExact.c"
                  ,0xbbc,"void Abc_ExactStoreTest(int)");
  }
  iVar1 = Abc_ExactDelayCost(pTruth,4,local_78,pPerm,&Cost,0xc);
  if (iVar1 != 1) {
    __assert_fail("Abc_ExactDelayCost( pTruth, 4, pArrTimeProfile, pPerm, &Cost, 12 ) == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcExact.c"
                  ,0xbbe,"void Abc_ExactStoreTest(int)");
  }
  pAVar3 = Abc_ExactBuildNode(pTruth,4,local_78,pFanins,pNtk);
  if (pAVar3 != (Abc_Obj_t *)0x0) {
    local_78[0] = 7;
    pAVar3 = Abc_ExactBuildNode(pTruth,4,local_78,pFanins,pNtk);
    if (pAVar3 == (Abc_Obj_t *)0x0) {
      Abc_ExactStop((char *)0x0);
      Abc_NtkDelete(pNtk);
      return;
    }
    __assert_fail("!Abc_ExactBuildNode( pTruth, 4, pArrTimeProfile, pFanins, pNtk )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcExact.c"
                  ,0xbc3,"void Abc_ExactStoreTest(int)");
  }
  __assert_fail("Abc_ExactBuildNode( pTruth, 4, pArrTimeProfile, pFanins, pNtk )",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcExact.c"
                ,0xbc0,"void Abc_ExactStoreTest(int)");
}

Assistant:

void Abc_ExactStoreTest( int fVerbose )
{
    int i;
    word pTruth[4] = {0xcafe, 0, 0, 0};
    int pArrTimeProfile[4] = {6, 2, 8, 5};
    Abc_Ntk_t * pNtk;
    Abc_Obj_t * pFanins[4];
    Vec_Ptr_t * vNames;
    char pPerm[4] = {0};
    int Cost = 0;

    pNtk = Abc_NtkAlloc( ABC_NTK_LOGIC, ABC_FUNC_SOP, 1 );
    pNtk->pName = Extra_UtilStrsav( "exact" );
    vNames = Abc_NodeGetFakeNames( 4u );

    /* primary inputs */
    Vec_PtrPush( pNtk->vObjs, NULL );
    for ( i = 0; i < 4; ++i )
    {
        pFanins[i] = Abc_NtkCreatePi( pNtk );
        Abc_ObjAssignName( pFanins[i], (char*)Vec_PtrEntry( vNames, i ), NULL );
    }
    Abc_NodeFreeNames( vNames );

    Abc_ExactStart( 10000, 1, fVerbose, 0, NULL );

    assert( !Abc_ExactBuildNode( pTruth, 4, pArrTimeProfile, pFanins, pNtk ) );

    assert( Abc_ExactDelayCost( pTruth, 4, pArrTimeProfile, pPerm, &Cost, 12 ) == 1 );

    assert( Abc_ExactBuildNode( pTruth, 4, pArrTimeProfile, pFanins, pNtk ) );

    (*pArrTimeProfile)++;
    assert( !Abc_ExactBuildNode( pTruth, 4, pArrTimeProfile, pFanins, pNtk ) );
    (*pArrTimeProfile)--;

    Abc_ExactStop( NULL );

    Abc_NtkDelete( pNtk );
}